

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O1

TreeNode * si9ma::BinaryTree::get_next(TreeNode *head)

{
  TreeNode *pTVar1;
  TreeNode *pTVar2;
  bool bVar3;
  
  if (head == (TreeNode *)0x0) {
    return (TreeNode *)0x0;
  }
  pTVar1 = head->right;
  if (head->right == (TreeNode *)0x0) {
    do {
      pTVar2 = head->parent;
      if (pTVar2 == (TreeNode *)0x0) {
        return (TreeNode *)0x0;
      }
      bVar3 = pTVar2->left != head;
      head = pTVar2;
    } while (bVar3);
  }
  else {
    do {
      pTVar2 = pTVar1;
      pTVar1 = pTVar2->left;
    } while (pTVar2->left != (TreeNode *)0x0);
  }
  return pTVar2;
}

Assistant:

const TreeNode* BinaryTree::get_next(const TreeNode *head) {
        if (head == nullptr)
            return head;

        if (head->right != nullptr)
            return get_left_most(head->right);
        else{
            auto *cur = head;
            auto *parent = head->parent;

            while (parent != nullptr && parent->left != cur){
                cur = parent;
                parent = parent->parent;
            }

            return parent;
        }
    }